

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

void run_container_add_range_nruns
               (run_container_t *run,uint32_t min,uint32_t max,int32_t nruns_less,
               int32_t nruns_greater)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  int *in_RDI;
  int in_R8D;
  uint32_t result_max;
  uint32_t result_min;
  uint32_t common_max;
  uint32_t common_min;
  int32_t nruns_common;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = (*in_RDI - in_ECX) - in_R8D;
  if (iVar1 == 0) {
    makeRoomAtIndex((run_container_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                    ,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    *(short *)(*(long *)(in_RDI + 2) + (long)in_ECX * 4) = (short)in_ESI;
    *(short *)(*(long *)(in_RDI + 2) + 2 + (long)in_ECX * 4) = (short)in_EDX - (short)in_ESI;
  }
  else {
    uVar2 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)in_ECX * 4);
    uVar3 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)(in_ECX + iVar1 + -1) * 4) +
            (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)(in_ECX + iVar1 + -1) * 4);
    if (uVar2 < in_ESI) {
      in_ESI = uVar2;
    }
    if (in_EDX < uVar3) {
      in_EDX = uVar3;
    }
    *(short *)(*(long *)(in_RDI + 2) + (long)in_ECX * 4) = (short)in_ESI;
    *(short *)(*(long *)(in_RDI + 2) + 2 + (long)in_ECX * 4) = (short)in_EDX - (short)in_ESI;
    memmove((void *)(*(long *)(in_RDI + 2) + (long)(in_ECX + 1) * 4),
            (void *)(*(long *)(in_RDI + 2) + (long)(*in_RDI - in_R8D) * 4),(long)in_R8D << 2);
    *in_RDI = in_ECX + 1 + in_R8D;
  }
  return;
}

Assistant:

static inline void run_container_add_range_nruns(run_container_t *run,
                                                 uint32_t min, uint32_t max,
                                                 int32_t nruns_less,
                                                 int32_t nruns_greater) {
    int32_t nruns_common = run->n_runs - nruns_less - nruns_greater;
    if (nruns_common == 0) {
        makeRoomAtIndex(run, (uint16_t)nruns_less);
        run->runs[nruns_less].value = (uint16_t)min;
        run->runs[nruns_less].length = (uint16_t)(max - min);
    } else {
        uint32_t common_min = run->runs[nruns_less].value;
        uint32_t common_max = run->runs[nruns_less + nruns_common - 1].value +
                              run->runs[nruns_less + nruns_common - 1].length;
        uint32_t result_min = (common_min < min) ? common_min : min;
        uint32_t result_max = (common_max > max) ? common_max : max;

        run->runs[nruns_less].value = (uint16_t)result_min;
        run->runs[nruns_less].length = (uint16_t)(result_max - result_min);

        memmove(&(run->runs[nruns_less + 1]),
                &(run->runs[run->n_runs - nruns_greater]),
                nruns_greater * sizeof(rle16_t));
        run->n_runs = nruns_less + 1 + nruns_greater;
    }
}